

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O3

bool __thiscall
chaiscript::Type_Conversions::has_conversion(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  const_iterator cVar1;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  cVar1 = find_bidir(this,to,from);
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->m_conversions)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool has_conversion(const Type_Info &to, const Type_Info &from) const {
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
      return find_bidir(to, from) != m_conversions.end();
    }